

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeFloatConstant(Builder *this,float f,bool specConstant)

{
  Id IVar1;
  Instruction *this_00;
  size_t size;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_58 [3];
  pointer local_40;
  Instruction *c;
  Op local_30;
  Id existing;
  uint value;
  anon_union_4_2_f9ecb22f u;
  Id typeId;
  Op opcode;
  bool specConstant_local;
  Builder *pBStack_18;
  float f_local;
  Builder *this_local;
  
  u.fl = 6.02558e-44;
  if (specConstant) {
    u.fl = 7.00649e-44;
  }
  size = 0x20;
  typeId._3_1_ = specConstant;
  opcode = (Op)f;
  pBStack_18 = this;
  value = makeFloatType(this,0x20);
  existing = opcode;
  local_30 = opcode;
  if ((typeId._3_1_ & 1) == 0) {
    size = 0x16;
    IVar1 = findScalarConstant(this,OpTypeFloat,u.ui,value,opcode);
    if (IVar1 != 0) {
      return IVar1;
    }
    c._4_4_ = 0;
  }
  this_00 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size);
  IVar1 = getUniqueId(this);
  Instruction::Instruction(this_00,IVar1,value,u.ui);
  local_40 = this_00;
  Instruction::addImmediateOperand(this_00,local_30);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_58,local_40
            );
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,(value_type *)local_58);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_58);
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
            (this->groupedConstants + 0x16,&local_40);
  Module::mapInstruction(&this->module,local_40);
  IVar1 = Instruction::getResultId(local_40);
  return IVar1;
}

Assistant:

Id Builder::makeFloatConstant(float f, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstant : OpConstant;
    Id typeId = makeFloatType(32);
    union { float fl; unsigned int ui; } u;
    u.fl = f;
    unsigned value = u.ui;

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = findScalarConstant(OpTypeFloat, opcode, typeId, value);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->addImmediateOperand(value);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeFloat].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}